

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

bool __thiscall FlowGraph::CanonicalizeLoops(FlowGraph *this)

{
  bool bVar1;
  ImplicitCallFlags IVar2;
  ImplicitCallFlags IVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  JITTimeFunctionBody *pJVar7;
  JITTimeProfileInfo *this_00;
  bool bVar8;
  Loop *pLVar9;
  
  pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  bVar1 = JITTimeFunctionBody::HasProfileInfo(pJVar7);
  if (bVar1) {
    pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    this_00 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar7);
    IVar2 = JITTimeProfileInfo::GetImplicitCallFlags(this_00);
    this->implicitCallFlags = IVar2;
    for (pLVar9 = this->loopList; pLVar9 != (Loop *)0x0; pLVar9 = pLVar9->next) {
      IVar2 = this->implicitCallFlags;
      IVar3 = Loop::GetImplicitCallFlags(pLVar9);
      this->implicitCallFlags = IVar3 | IVar2;
    }
  }
  Dump(this,true,L"\n Before canonicalizeLoops \n");
  pLVar9 = this->loopList;
  bVar8 = false;
  bVar1 = false;
  do {
    if (pLVar9 == (Loop *)0x0) {
      Dump(this,true,L"\n After canonicalizeLoops \n");
      return bVar1;
    }
    Loop::InsertLandingPad(pLVar9,this);
    BVar6 = Func::HasTry(this->func);
    if (BVar6 == 0) {
LAB_00418433:
      bVar5 = Loop::RemoveBreakBlocks(pLVar9,this);
      bVar1 = bVar8;
      if (bVar5) {
        bVar1 = true;
      }
      bVar5 = bVar1;
      if (bVar8) {
        bVar1 = bVar8;
        bVar5 = bVar8;
      }
    }
    else {
      bVar4 = Func::DoOptimizeTry(this->func);
      bVar5 = bVar8;
      if (bVar4) goto LAB_00418433;
    }
    bVar8 = bVar5;
    pLVar9 = pLVar9->next;
  } while( true );
}

Assistant:

bool
FlowGraph::CanonicalizeLoops()
{
    if (this->func->HasProfileInfo())
    {
        this->implicitCallFlags = this->func->GetReadOnlyProfileInfo()->GetImplicitCallFlags();
        for (Loop *loop = this->loopList; loop; loop = loop->next)
        {
            this->implicitCallFlags = (Js::ImplicitCallFlags)(this->implicitCallFlags | loop->GetImplicitCallFlags());
        }
    }

#if DBG_DUMP
    this->Dump(true, _u("\n Before canonicalizeLoops \n"));
#endif

    bool breakBlockRelocated = false;

    for (Loop *loop = this->loopList; loop; loop = loop->next)
    {
        loop->InsertLandingPad(this);
        if (!this->func->HasTry() || this->func->DoOptimizeTry())
        {
            bool relocated = loop->RemoveBreakBlocks(this);
            if (!breakBlockRelocated && relocated)
            {
                breakBlockRelocated  = true;
            }
        }
    }

#if DBG_DUMP
    this->Dump(true, _u("\n After canonicalizeLoops \n"));
#endif

    return breakBlockRelocated;
}